

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O0

bool bssl::check_signature_credential(SSL_HANDSHAKE *hs,SSL_CREDENTIAL *cred,uint16_t *out_sigalg)

{
  bool bVar1;
  unsigned_short *puVar2;
  unsigned_short *puVar3;
  uint16_t *out_sigalg_local;
  SSL_CREDENTIAL *cred_local;
  SSL_HANDSHAKE *hs_local;
  
  if (cred->type != kX509) {
    if (cred->type != kDelegated) {
      ERR_put_error(0x10,0,0xe4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                    ,0x113);
      return false;
    }
    puVar2 = Array<unsigned_short>::begin(&hs->peer_sigalgs);
    puVar3 = Array<unsigned_short>::end(&hs->peer_sigalgs);
    puVar2 = std::find<unsigned_short*,unsigned_short>(puVar2,puVar3,&cred->dc_algorithm);
    puVar3 = Array<unsigned_short>::end(&hs->peer_sigalgs);
    if (puVar2 == puVar3) {
      ERR_put_error(0x10,0,0xfd,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                    ,0x10e);
      return false;
    }
  }
  bVar1 = tls1_choose_signature_algorithm(hs,cred,out_sigalg);
  if (bVar1) {
    hs_local._7_1_ = ssl_credential_matches_requested_issuers(hs,cred);
  }
  else {
    hs_local._7_1_ = false;
  }
  return hs_local._7_1_;
}

Assistant:

static bool check_signature_credential(SSL_HANDSHAKE *hs,
                                       const SSL_CREDENTIAL *cred,
                                       uint16_t *out_sigalg) {
  switch (cred->type) {
    case SSLCredentialType::kX509:
      break;
    case SSLCredentialType::kDelegated:
      // Check that the peer supports the signature over the delegated
      // credential.
      if (std::find(hs->peer_sigalgs.begin(), hs->peer_sigalgs.end(),
                    cred->dc_algorithm) == hs->peer_sigalgs.end()) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_NO_COMMON_SIGNATURE_ALGORITHMS);
        return false;
      }
      break;
    default:
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNKNOWN_CERTIFICATE_TYPE);
      return false;
  }

  // If we reach here then the credential requires a signature. If |cred| is a
  // delegated credential, this also checks that the peer supports delegated
  // credentials and matched |dc_cert_verify_algorithm|.
  if (!tls1_choose_signature_algorithm(hs, cred, out_sigalg)) {
    return false;
  }
  // Use this credential if it either matches a requested issuer,
  // or does not require issuer matching.
  return ssl_credential_matches_requested_issuers(hs, cred);
}